

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::BVS_RL(CPU *this)

{
  byte bVar1;
  
  this->cycles = 2;
  bVar1 = GetByte(this);
  this->pc = this->pc + (short)(char)((char)((this->field_6).ps * '\x02') >> 7 & bVar1);
  return;
}

Assistant:

void CPU::BVS_RL()
{
    cycles = 2;
    uint8_t offset = GetByte();
    pc += (V) ? static_cast<int8_t>(offset) : 0;
}